

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall tinyusdz::Prim::add_child(Prim *this,Prim *rhs,bool rename_prim_name,string *err)

{
  Path *pPVar1;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pPVar2;
  string *this_01;
  bool bVar3;
  size_type sVar4;
  string *args;
  undefined7 in_register_00000011;
  string *in;
  ulong uVar5;
  undefined4 uVar6;
  long lVar7;
  string unique_name;
  string elementName;
  allocator local_181;
  string *local_180;
  undefined4 local_174;
  Prim *local_170;
  Path *local_168;
  string local_160;
  key_type local_140;
  string local_120;
  Path local_100;
  
  uVar6 = (undefined4)CONCAT71(in_register_00000011,rename_prim_name);
  pPVar1 = &rhs->_elementPath;
  args = err;
  std::__cxx11::string::string((string *)&local_140,(string *)pPVar1);
  if (local_140._M_string_length == 0) {
    if (rename_prim_name) {
      std::__cxx11::string::assign((char *)&local_140);
      bVar3 = SetPrimElementName(&rhs->_data,&local_140);
      if (bVar3) {
        std::__cxx11::string::string((string *)&local_160,"",(allocator *)&local_120);
        Path::Path(&local_100,&local_140,&local_160);
        Path::operator=(pPVar1,&local_100);
        Path::~Path(&local_100);
        std::__cxx11::string::_M_dispose();
        goto LAB_001366f2;
      }
      if (err == (string *)0x0) goto LAB_00136aab;
      std::__cxx11::string::string
                ((string *)&local_160,"Internal error. cannot modify Prim\'s elementName.\n",
                 (allocator *)&local_120);
      fmt::format(&local_100._prim_part,&local_160);
LAB_00136a08:
      std::__cxx11::string::operator=((string *)err,(string *)&local_100);
      std::__cxx11::string::_M_dispose();
      goto LAB_00136aa6;
    }
    if (err != (string *)0x0) {
LAB_001369c9:
      std::__cxx11::string::assign((char *)err);
    }
  }
  else {
LAB_001366f2:
    this_00 = &this->_childrenNameSet;
    local_180 = err;
    local_174 = uVar6;
    local_170 = rhs;
    local_168 = pPVar1;
    if (((long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x350 !=
        (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this_00->_M_t);
      lVar7 = 0x1a0;
      for (uVar5 = 0;
          pPVar2 = (this->_children).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar5 < (ulong)(((long)(this->_children).
                                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x350)
          ; uVar5 = uVar5 + 1) {
        err = local_180;
        if ((*(long *)((long)&(pPVar2->_abs_path)._prim_part._M_string_length + lVar7) == 0) ||
           (sVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this_00->_M_t,
                            (key_type *)((long)&(pPVar2->_abs_path)._prim_part._M_dataplus + lVar7))
           , err = local_180, sVar4 != 0)) {
          local_180 = err;
          if (err != (string *)0x0) goto LAB_001369c9;
          goto LAB_00136aab;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_equal<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((this->_children).
                             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part.
                           _M_dataplus + lVar7));
        lVar7 = lVar7 + 0x350;
      }
    }
    sVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->_M_t,&local_140);
    pPVar1 = local_168;
    err = local_180;
    if (sVar4 == 0) {
LAB_00136825:
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_equal<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,&local_140);
      std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_children,local_170);
      this->_child_dirty = true;
      bVar3 = true;
      goto LAB_00136aad;
    }
    if ((char)local_174 == '\0') {
      if (local_180 != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_160,"Prim name(elementName) {} already exists in children.\n",
                   (allocator *)&local_120);
        fmt::format<std::__cxx11::string>
                  (&local_100._prim_part,(fmt *)&local_160,&pPVar1->_prim_part,args);
        goto LAB_00136a08;
      }
    }
    else {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_local_buf[0] = '\0';
      bVar3 = makeUniqueName(this_00,&local_140,&local_160);
      pPVar1 = local_168;
      this_01 = local_180;
      if (bVar3) {
        bVar3 = ValidatePrimElementName(&local_160);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&local_140);
          bVar3 = SetPrimElementName(&local_170->_data,&local_140);
          if (bVar3) {
            std::__cxx11::string::string((string *)&local_120,"",&local_181);
            Path::Path(&local_100,&local_140,&local_120);
            Path::operator=(pPVar1,&local_100);
            Path::~Path(&local_100);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            goto LAB_00136825;
          }
          if (this_01 == (string *)0x0) goto LAB_00136aa6;
          std::__cxx11::string::string
                    ((string *)&local_120,"Internal error. cannot modify Prim\'s elementName.\n",
                     &local_181);
          fmt::format(&local_100._prim_part,&local_120);
LAB_00136a86:
          std::__cxx11::string::operator=((string *)this_01,(string *)&local_100);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        else if (this_01 != (string *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_120,
                     "Internally generated Prim name `{}` is invalid as a Prim name.\n",&local_181);
          in = &local_160;
          goto LAB_00136a7b;
        }
      }
      else if (local_180 != (string *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_120,"Internal error. cannot assign unique name for `{}`.\n",
                   &local_181);
        in = &local_140;
LAB_00136a7b:
        fmt::format<std::__cxx11::string>(&local_100._prim_part,(fmt *)&local_120,in,args);
        goto LAB_00136a86;
      }
LAB_00136aa6:
      std::__cxx11::string::_M_dispose();
    }
  }
LAB_00136aab:
  bVar3 = false;
LAB_00136aad:
  std::__cxx11::string::_M_dispose();
  return bVar3;
}

Assistant:

bool Prim::add_child(Prim &&rhs, const bool rename_prim_name,
                     std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  std::string elementName = rhs.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {
      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = "Prim has empty elementName.\n";
      }
      return false;
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  DCOUT("elementName = " << elementName);

  if (_childrenNameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_childrenNameSet, elementName, &unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot assign unique name for `{}`.\n",
              elementName);
        }
        return false;
      }

      // Ensure valid Prim name
      if (!ValidatePrimElementName(unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internally generated Prim name `{}` is invalid as a Prim "
              "name.\n",
              unique_name);
        }
        return false;
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      DCOUT("elementName = " << elementName);
      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = fmt::format(
            "Prim name(elementName) {} already exists in children.\n",
            rhs.element_name());
      }
      return false;
    }
  }

  DCOUT("rhs.elementName = " << rhs.element_name());

  _childrenNameSet.insert(elementName);
  _children.emplace_back(std::move(rhs));
  _child_dirty = true;

  return true;
}